

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O1

void __thiscall helics::Input::handleCallback(Input *this,Time time)

{
  variant<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
  *__v;
  bool bVar1;
  _Any_data *p_Var2;
  TimeRepresentation<count_time<9,_long>_> *pTVar3;
  ulong uVar4;
  complex<double> *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> val;
  undefined1 local_50 [8];
  NamedPoint local_48;
  
  if ((this->hasUpdate == false) && (bVar1 = checkUpdate(this,false), !bVar1)) {
    return;
  }
  __v = &this->value_callback;
  switch(*(__index_type *)
          ((long)&(this->value_callback).
                  super__Variant_base<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
                  .
                  super__Move_assign_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
                  .
                  super__Copy_assign_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
                  .
                  super__Move_ctor_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
                  .
                  super__Copy_ctor_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
                  .
                  super__Variant_storage_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
          + 0x20)) {
  case '\0':
    getValue_impl<double>(this,local_50);
    p_Var2 = (_Any_data *)
             std::
             get<0ul,std::function<void(double_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(long_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::__cxx11::string_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::complex<double>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<double,std::allocator<double>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(helics::NamedPoint_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(bool_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(TimeRepresentation<count_time<9,long>>const&,TimeRepresentation<count_time<9,long>>)>>
                       (__v);
    break;
  case '\x01':
    getValue_impl<long>(this,local_50);
    p_Var2 = (_Any_data *)
             std::
             get<1ul,std::function<void(double_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(long_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::__cxx11::string_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::complex<double>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<double,std::allocator<double>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(helics::NamedPoint_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(bool_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(TimeRepresentation<count_time<9,long>>const&,TimeRepresentation<count_time<9,long>>)>>
                       (__v);
    break;
  default:
    getValue_impl<std::__cxx11::string>(local_50 + 8,this);
    p_Var2 = (_Any_data *)
             std::
             get<2ul,std::function<void(double_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(long_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::__cxx11::string_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::complex<double>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<double,std::allocator<double>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(helics::NamedPoint_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(bool_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(TimeRepresentation<count_time<9,long>>const&,TimeRepresentation<count_time<9,long>>)>>
                       (__v);
    if (*(long *)(p_Var2 + 1) == 0) {
      local_50 = (undefined1  [8])time.internalTimeCode;
      std::__throw_bad_function_call();
    }
    local_50 = (undefined1  [8])time.internalTimeCode;
    (**(code **)(p_Var2->_M_pod_data + 0x18))
              (p_Var2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_50 + 8),(TimeRepresentation<count_time<9,_long>_> *)local_50);
    goto LAB_00246e10;
  case '\x03':
    local_48.name._M_dataplus._M_p = (pointer)0x0;
    local_48.name._M_string_length = 0;
    getValue_impl<std::complex<double>>(this,local_50 + 8);
    p_Var2 = (_Any_data *)
             std::
             get<3ul,std::function<void(double_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(long_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::__cxx11::string_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::complex<double>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<double,std::allocator<double>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(helics::NamedPoint_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(bool_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(TimeRepresentation<count_time<9,long>>const&,TimeRepresentation<count_time<9,long>>)>>
                       (__v);
    local_50 = (undefined1  [8])time.internalTimeCode;
    if (*(long *)(p_Var2 + 1) == 0) goto LAB_00246f64;
    pcVar5 = (complex<double> *)(local_50 + 8);
    pTVar3 = (TimeRepresentation<count_time<9,_long>_> *)local_50;
    goto LAB_00246e8c;
  case '\x04':
    getValue_impl<std::vector<double,std::allocator<double>>>(local_50 + 8,this);
    p_Var2 = (_Any_data *)
             std::
             get<4ul,std::function<void(double_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(long_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::__cxx11::string_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::complex<double>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<double,std::allocator<double>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(helics::NamedPoint_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(bool_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(TimeRepresentation<count_time<9,long>>const&,TimeRepresentation<count_time<9,long>>)>>
                       (__v);
    if (*(long *)(p_Var2 + 1) == 0) {
      local_50 = (undefined1  [8])time.internalTimeCode;
      std::__throw_bad_function_call();
    }
    local_50 = (undefined1  [8])time.internalTimeCode;
    (**(code **)(p_Var2->_M_pod_data + 0x18))
              (p_Var2,(vector<double,_std::allocator<double>_> *)(local_50 + 8),
               (TimeRepresentation<count_time<9,_long>_> *)local_50);
    goto LAB_00246f41;
  case '\x05':
    getValue_impl<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>
              (local_50 + 8,this);
    p_Var2 = (_Any_data *)
             std::
             get<5ul,std::function<void(double_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(long_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::__cxx11::string_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::complex<double>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<double,std::allocator<double>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(helics::NamedPoint_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(bool_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(TimeRepresentation<count_time<9,long>>const&,TimeRepresentation<count_time<9,long>>)>>
                       (__v);
    if (*(long *)(p_Var2 + 1) == 0) {
      local_50 = (undefined1  [8])time.internalTimeCode;
      std::__throw_bad_function_call();
    }
    local_50 = (undefined1  [8])time.internalTimeCode;
    (**(code **)(p_Var2->_M_pod_data + 0x18))
              (p_Var2,(vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                      (local_50 + 8),(TimeRepresentation<count_time<9,_long>_> *)local_50);
LAB_00246f41:
    if (local_48.name._M_dataplus._M_p == (pointer)0x0) {
      return;
    }
    uVar4 = local_48.name.field_2._M_allocated_capacity - (long)local_48.name._M_dataplus._M_p;
    goto LAB_00246f53;
  case '\x06':
    getValue_impl<helics::NamedPoint>(local_50 + 8,this);
    p_Var2 = (_Any_data *)
             std::
             get<6ul,std::function<void(double_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(long_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::__cxx11::string_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::complex<double>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<double,std::allocator<double>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(helics::NamedPoint_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(bool_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(TimeRepresentation<count_time<9,long>>const&,TimeRepresentation<count_time<9,long>>)>>
                       (__v);
    if (*(long *)(p_Var2 + 1) == 0) {
      local_50 = (undefined1  [8])time.internalTimeCode;
      std::__throw_bad_function_call();
    }
    local_50 = (undefined1  [8])time.internalTimeCode;
    (**(code **)(p_Var2->_M_pod_data + 0x18))
              (p_Var2,(NamedPoint *)(local_50 + 8),
               (TimeRepresentation<count_time<9,_long>_> *)local_50);
LAB_00246e10:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.name._M_dataplus._M_p == &local_48.name.field_2) {
      return;
    }
    uVar4 = local_48.name.field_2._M_allocated_capacity + 1;
LAB_00246f53:
    operator_delete(local_48.name._M_dataplus._M_p,uVar4);
    return;
  case '\a':
    getValue_impl<bool>(this,local_50);
    p_Var2 = (_Any_data *)
             std::
             get<7ul,std::function<void(double_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(long_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::__cxx11::string_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::complex<double>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<double,std::allocator<double>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(helics::NamedPoint_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(bool_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(TimeRepresentation<count_time<9,long>>const&,TimeRepresentation<count_time<9,long>>)>>
                       (__v);
    break;
  case '\b':
    getValue_impl<TimeRepresentation<count_time<9,long>>>(this,local_50);
    p_Var2 = (_Any_data *)
             std::
             get<8ul,std::function<void(double_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(long_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::__cxx11::string_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::complex<double>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<double,std::allocator<double>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(helics::NamedPoint_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(bool_const&,TimeRepresentation<count_time<9,long>>)>,std::function<void(TimeRepresentation<count_time<9,long>>const&,TimeRepresentation<count_time<9,long>>)>>
                       (__v);
  }
  local_48.name._M_dataplus._M_p = (pointer)time.internalTimeCode;
  if (*(_Manager_type *)(p_Var2 + 1) == (_Manager_type)0x0) {
LAB_00246f64:
    std::__throw_bad_function_call();
  }
  pcVar5 = (complex<double> *)local_50;
  pTVar3 = (TimeRepresentation<count_time<9,_long>_> *)(local_50 + 8);
LAB_00246e8c:
  (**(code **)(p_Var2->_M_pod_data + 0x18))(p_Var2,pcVar5,pTVar3);
  return;
}

Assistant:

void Input::handleCallback(Time time)
{
    if (!isUpdated()) {
        return;
    }
    switch (value_callback.index()) {
        case double_loc: {
            auto val = getValue<double>();
            std::get<std::function<void(const double&, Time)>>(value_callback)(val, time);
        } break;
        case int_loc: {
            auto val = getValue<int64_t>();
            std::get<std::function<void(const int64_t&, Time)>>(value_callback)(val, time);
        } break;
        case string_loc:
        default: {
            auto val = getValue<std::string>();
            std::get<std::function<void(const std::string&, Time)>>(value_callback)(val, time);
        } break;
        case complex_loc: {
            auto val = getValue<std::complex<double>>();
            std::get<std::function<void(const std::complex<double>&, Time)>>(value_callback)(val,
                                                                                             time);
        } break;
        case vector_loc: {
            auto val = getValue<std::vector<double>>();
            std::get<std::function<void(const std::vector<double>&, Time)>>(value_callback)(val,
                                                                                            time);
        } break;
        case complex_vector_loc: {
            auto val = getValue<std::vector<std::complex<double>>>();
            std::get<std::function<void(const std::vector<std::complex<double>>&, Time)>>(
                value_callback)(val, time);
        } break;
        case named_point_loc: {
            auto val = getValue<NamedPoint>();
            std::get<std::function<void(const NamedPoint&, Time)>>(value_callback)(val, time);
        } break;
        case 7:  // bool loc
        {
            auto val = getValue<bool>();
            std::get<std::function<void(const bool&, Time)>>(value_callback)(val, time);
        } break;
        case 8:  // Time loc
        {
            auto val = getValue<Time>();
            std::get<std::function<void(const Time&, Time)>>(value_callback)(val, time);
        } break;
    }
}